

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O1

spv_result_t spvtools::val::FunctionPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer ppVar2;
  pointer pIVar3;
  EnumSet<spv::Capability> *this;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *this_00;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  AddressingModel AVar9;
  uint id;
  Op OVar10;
  uint32_t id_00;
  StorageClass SVar11;
  Instruction *pIVar12;
  undefined8 *puVar13;
  __normal_iterator<const_spv::Op_*,_std::vector<spv::Op,_std::allocator<spv::Op>_>_> _Var14;
  Instruction *pIVar15;
  Instruction *pIVar16;
  _Rb_tree_header *p_Var17;
  _Rb_tree_const_iterator<spvtools::val::Decoration> __it;
  _Base_ptr p_Var18;
  Instruction *rhs;
  mapped_type *pmVar19;
  _Rb_tree_node_base *p_Var20;
  long lVar21;
  pointer ppVar22;
  _Rb_tree_header *p_Var23;
  char *pcVar24;
  ulong uVar25;
  size_t sVar26;
  _Rb_tree_node_base *p_Var27;
  size_t index;
  pointer pIVar28;
  pointer this_01;
  spv_result_t local_29c;
  string local_290;
  uint local_26c;
  Instruction *local_268;
  Instruction *local_260;
  size_t local_258;
  uint local_24c;
  mapped_type *local_248;
  string local_240;
  EnumSet<spv::Capability> *local_220;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_218;
  Instruction *local_210;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  local_268 = inst;
  if (uVar1 == 0x39) {
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar12 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar12 == (Instruction *)0x0) || ((pIVar12->inst_).opcode != 0x36)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunctionCall Function <id> ",0x1d);
      ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
      pcVar24 = " is not a function.";
      lVar21 = 0x13;
LAB_001ea92c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar21);
      local_29c = local_208.error_;
      goto LAB_001eabd2;
    }
    pIVar15 = ValidationState_t::FindDef(_,(pIVar12->inst_).type_id);
    if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).result_id != (inst->inst_).type_id)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunctionCall Result Type <id> ",0x20);
      ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
      ValidationState_t::getIdName_abi_cxx11_(&local_240,_,(pIVar15->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_240._M_dataplus._M_p,local_240._M_string_length);
      pcVar24 = "s return type.";
      lVar21 = 0xe;
      goto LAB_001eaba0;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar12,3);
    pIVar12 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar12 == (Instruction *)0x0) || ((pIVar12->inst_).opcode != 0x21)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "Missing function type definition.";
      lVar21 = 0x21;
    }
    else {
      if ((long)(pIVar12->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar12->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2 ==
          ((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2) + -1) {
        if (0x30 < (ulong)((long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          local_218 = &_->id_decorations_;
          local_220 = &_->module_capabilities_;
          index = 2;
          sVar26 = 3;
          do {
            pIVar15 = local_268;
            uVar8 = Instruction::GetOperandAs<unsigned_int>(local_268,sVar26);
            pIVar16 = ValidationState_t::FindDef(_,uVar8);
            local_258 = index;
            if (pIVar16 == (Instruction *)0x0) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Missing argument ",0x11);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              lVar21 = 0xc;
              pcVar24 = " definition.";
LAB_001ea700:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,pcVar24,lVar21);
              local_29c = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar5 = false;
            }
            else {
              local_210 = pIVar16;
              local_260 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
              if (local_260 == (Instruction *)0x0) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Missing argument ",0x11);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                lVar21 = 0x11;
                pcVar24 = " type definition.";
                goto LAB_001ea700;
              }
              local_26c = uVar8;
              local_24c = Instruction::GetOperandAs<unsigned_int>(pIVar12,index);
              pIVar15 = ValidationState_t::FindDef(_,local_24c);
              this_00 = local_218;
              if ((pIVar15 == (Instruction *)0x0) ||
                 ((local_260->inst_).result_id != (pIVar15->inst_).result_id)) {
                if ((_->options_->before_hlsl_legalization == true) &&
                   (((local_260->inst_).opcode == 0x20 && ((pIVar15->inst_).opcode == 0x20)))) {
                  local_208._0_4_ = (local_260->inst_).result_id;
                  local_248 = std::
                              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                              ::operator[](local_218,(key_type_conflict *)&local_208);
                  local_208._0_4_ = (pIVar15->inst_).result_id;
                  pmVar19 = std::
                            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                            ::operator[](this_00,(key_type_conflict *)&local_208);
                  p_Var18 = (pmVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  p_Var17 = &(pmVar19->_M_t)._M_impl.super__Rb_tree_header;
                  if ((_Rb_tree_header *)p_Var18 != p_Var17) {
                    p_Var23 = &(local_248->_M_t)._M_impl.super__Rb_tree_header;
                    do {
                      local_208._0_8_ = p_Var18 + 1;
                      __it._M_node = (local_248->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                     _M_left;
                      while (((_Rb_tree_header *)__it._M_node != p_Var23 &&
                             (bVar5 = __gnu_cxx::__ops::
                                      _Iter_equals_val<spvtools::val::Decoration_const>::operator()
                                                ((_Iter_equals_val<spvtools::val::Decoration_const>
                                                  *)&local_208,__it), !bVar5))) {
                        __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
                      }
                      if ((_Rb_tree_header *)__it._M_node == p_Var23) goto LAB_001ea5b8;
                      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
                    } while ((_Rb_tree_header *)p_Var18 != p_Var17);
                  }
                  uVar8 = Instruction::GetOperandAs<unsigned_int>(local_260,2);
                  id = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
                  if (uVar8 != id) {
                    pIVar16 = ValidationState_t::FindDef(_,uVar8);
                    rhs = ValidationState_t::FindDef(_,id);
                    bVar5 = ValidationState_t::LogicallyMatch(_,pIVar16,rhs,true);
                    if (!bVar5) goto LAB_001ea5b8;
                  }
                  goto LAB_001ea2da;
                }
LAB_001ea5b8:
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,local_268);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"OpFunctionCall Argument <id> ",0x1d);
                ValidationState_t::getIdName_abi_cxx11_(&local_290,_,local_26c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_290._M_dataplus._M_p,
                           local_290._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
                ValidationState_t::getIdName_abi_cxx11_(&local_240,_,local_24c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_240._M_dataplus._M_p,
                           local_240._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"s parameter type.",0x11);
                local_29c = local_208.error_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_240._M_dataplus._M_p != &local_240.field_2) {
                  operator_delete(local_240._M_dataplus._M_p,
                                  local_240.field_2._M_allocated_capacity + 1);
                }
LAB_001ea683:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p,
                                  local_290.field_2._M_allocated_capacity + 1);
                }
                DiagnosticStream::~DiagnosticStream(&local_208);
                bVar5 = false;
              }
              else {
LAB_001ea2da:
                AVar9 = ValidationState_t::addressing_model(_);
                bVar5 = true;
                if ((AVar9 == Logical) &&
                   (((uVar1 = (pIVar15->inst_).opcode, uVar1 == 0x1141 || (uVar1 == 0x20)) &&
                    (_->options_->relax_logical_pointer == false)))) {
                  SVar11 = Instruction::GetOperandAs<spv::StorageClass>(pIVar15,1);
                  this = local_220;
                  if (StorageBuffer < SVar11) {
LAB_001ea80e:
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,local_268);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid storage class for pointer operand ",
                               0x2a);
                    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,local_26c);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,local_290._M_dataplus._M_p,
                               local_290._M_string_length);
                    local_29c = local_208.error_;
                    goto LAB_001ea683;
                  }
                  if ((0x4d1U >> (SVar11 & 0x1f) & 1) == 0) {
                    if (SVar11 != StorageBuffer) goto LAB_001ea80e;
                    if ((_->features_).variable_pointers != false) goto LAB_001ea33d;
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,local_268);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"StorageBuffer pointer operand ",0x1e);
                    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,local_26c);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,local_290._M_dataplus._M_p,
                               local_290._M_string_length);
                    lVar21 = 0x28;
                    pcVar24 = " requires a variable pointers capability";
LAB_001ea7c8:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,pcVar24,lVar21);
                    local_29c = local_208.error_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290._M_dataplus._M_p != &local_290.field_2) {
                      operator_delete(local_290._M_dataplus._M_p,
                                      local_290.field_2._M_allocated_capacity + 1);
                    }
                    DiagnosticStream::~DiagnosticStream(&local_208);
                    bVar5 = false;
                  }
                  else {
LAB_001ea33d:
                    uVar1 = (local_210->inst_).opcode;
                    if (((uVar1 != 0x37) && (uVar1 != 0x3b)) && (uVar1 != 0x1142)) {
                      bVar6 = EnumSet<spv::Capability>::contains
                                        (local_220,CapabilityVariablePointersStorageBuffer);
                      bVar7 = EnumSet<spv::Capability>::contains(this,CapabilityVariablePointers);
                      bVar5 = true;
                      if (((SVar11 != UniformConstant) && (SVar11 != StorageBuffer || !bVar6)) &&
                         (bVar5 = true, SVar11 != Workgroup || !bVar7)) {
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,local_268);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Pointer operand ",0x10);
                        ValidationState_t::getIdName_abi_cxx11_(&local_290,_,local_26c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,local_290._M_dataplus._M_p,
                                   local_290._M_string_length);
                        lVar21 = 0x24;
                        pcVar24 = " must be a memory object declaration";
                        goto LAB_001ea7c8;
                      }
                    }
                  }
                }
              }
            }
            if (!bVar5) goto LAB_001eabf1;
            sVar26 = sVar26 + 1;
            index = local_258 + 1;
          } while (sVar26 < (ulong)((long)(local_268->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_268->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
LAB_001eb080:
        local_29c = SPV_SUCCESS;
        goto LAB_001eabf1;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpFunctionCall Function <id>\'s parameter count does not match the argument count."
      ;
      lVar21 = 0x51;
    }
    goto LAB_001eaa59;
  }
  if (uVar1 != 0x37) {
    if (uVar1 != 0x36) {
      return SPV_SUCCESS;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    pIVar12 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar12 == (Instruction *)0x0) || ((pIVar12->inst_).opcode != 0x21)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunction Function Type <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
      pcVar24 = " is not a function type.";
      lVar21 = 0x18;
      goto LAB_001ea92c;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar12,1);
    if (uVar8 == (inst->inst_).type_id) {
      puVar13 = (undefined8 *)operator_new(0x38);
      puVar13[6] = 0x500000146;
      puVar13[4] = 0x12700000126;
      puVar13[5] = 0x14500000128;
      puVar13[2] = 0x14b00000010;
      puVar13[3] = 0x12500000039;
      *puVar13 = 0x470000004a;
      puVar13[1] = 0xf00000124;
      ppVar22 = (inst->uses_).
                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (inst->uses_).
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar22 != ppVar2) {
        do {
          uVar4 = local_208._0_8_;
          pIVar12 = ppVar22->first;
          local_208._2_2_ = 0;
          local_208._0_2_ = (pIVar12->inst_).opcode;
          local_208._4_4_ = SUB84(uVar4,4);
          _Var14 = std::
                   __find_if<__gnu_cxx::__normal_iterator<spv::Op_const*,std::vector<spv::Op,std::allocator<spv::Op>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                             (puVar13,puVar13 + 7,&local_208);
          if ((_Var14._M_current != (Op *)(puVar13 + 7)) ||
             (bVar5 = Instruction::IsNonSemantic(pIVar12), bVar5)) {
            bVar5 = true;
          }
          else {
            bVar6 = Instruction::IsDebugInfo(pIVar12);
            bVar5 = true;
            if (!bVar6) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Invalid use of function result id ",0x22);
              ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(local_268->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_290._M_dataplus._M_p,local_290._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
              local_258 = CONCAT44(local_258._4_4_,local_208.error_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar5 = false;
            }
          }
          if (!bVar5) {
            local_29c = (spv_result_t)local_258;
            goto LAB_001ead6b;
          }
          ppVar22 = ppVar22 + 1;
        } while (ppVar22 != ppVar2);
      }
      local_29c = SPV_SUCCESS;
LAB_001ead6b:
      operator_delete(puVar13,0x38);
      goto LAB_001eabf1;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"OpFunction Result Type <id> ",0x1c);
    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," does not match the Function Type\'s return type <id> ",0x35);
    ValidationState_t::getIdName_abi_cxx11_(&local_240,_,uVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_240._M_dataplus._M_p,local_240._M_string_length);
    pcVar24 = ".";
    lVar21 = 1;
LAB_001eaba0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar21);
    local_29c = local_208.error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
LAB_001eabd2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001eabec;
  }
  sVar26 = inst->line_num_;
  if (sVar26 - 1 == 0) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
    pcVar24 = "Function parameter cannot be the first instruction.";
    lVar21 = 0x33;
LAB_001eaa59:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar21);
    local_29c = local_208.error_;
  }
  else {
    pIVar3 = (_->ordered_instructions_).
             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar21 = sVar26 - 2;
    if (lVar21 == 0) {
      uVar25 = 0;
      this_01 = pIVar3 + (sVar26 - 1);
    }
    else {
      pIVar28 = pIVar3 + (sVar26 - 2);
      uVar25 = 0;
      do {
        uVar1 = (pIVar28->inst_).opcode;
        this_01 = pIVar28;
        if (uVar1 == 0x36) break;
        uVar25 = uVar25 + (uVar1 == 0x37);
        pIVar28 = pIVar28 + -1;
        lVar21 = lVar21 + -1;
        this_01 = pIVar3 + 1;
      } while (lVar21 != 0);
    }
    if ((this_01->inst_).opcode != 0x36) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar24 = "Function parameter must be preceded by a function.";
      lVar21 = 0x32;
      goto LAB_001eaa59;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>(this_01,3);
    pIVar12 = ValidationState_t::FindDef(_,uVar8);
    if (pIVar12 == (Instruction *)0x0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Missing function type definition.",0x21);
      local_29c = local_208.error_;
    }
    else {
      if (uVar25 < ((long)(pIVar12->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pIVar12->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 3U) {
        p_Var27 = (_Rb_tree_node_base *)(uVar25 + 2);
        uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar12,(size_t)p_Var27);
        pIVar12 = ValidationState_t::FindDef(_,uVar8);
        if ((pIVar12 == (Instruction *)0x0) ||
           (id_00 = (pIVar12->inst_).result_id, (inst->inst_).type_id != id_00)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"OpFunctionParameter Result Type <id> ",0x25);
          ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          pcVar24 = " does not match the OpTypeFunction parameter type of the same index.";
          lVar21 = 0x44;
          goto LAB_001ea92c;
        }
        while( true ) {
          OVar10 = ValidationState_t::GetIdOpcode(_,id_00);
          if (OVar10 != OpTypeArray) break;
          pIVar12 = ValidationState_t::FindDef(_,id_00);
          id_00 = Instruction::GetOperandAs<unsigned_int>(pIVar12,1);
        }
        OVar10 = ValidationState_t::GetIdOpcode(_,id_00);
        if ((OVar10 != OpTypePointer) &&
           (OVar10 = ValidationState_t::GetIdOpcode(_,id_00), OVar10 != OpTypeUntypedPointerKHR))
        goto LAB_001eb080;
        pIVar12 = ValidationState_t::FindDef(_,id_00);
        SVar11 = Instruction::GetOperandAs<spv::StorageClass>(pIVar12,1);
        if (SVar11 == PhysicalStorageBuffer) {
          local_208._0_4_ = (inst->inst_).result_id;
          pmVar19 = std::
                    map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                    ::operator[](&_->id_decorations_,(key_type_conflict *)&local_208);
          p_Var17 = &(pmVar19->_M_t)._M_impl.super__Rb_tree_header;
          p_Var27 = (pmVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          for (p_Var20 = p_Var27;
              ((_Rb_tree_header *)p_Var20 != p_Var17 && (p_Var20[1]._M_color != 0x14));
              p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
          }
          for (; ((_Rb_tree_header *)p_Var27 != p_Var17 && (p_Var27[1]._M_color != 0x13));
              p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27)) {
          }
          if ((_Rb_tree_header *)p_Var27 == p_Var17 && (_Rb_tree_header *)p_Var20 == p_Var17) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpFunctionParameter ",0x14);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            pcVar24 = ": expected Aliased or Restrict for PhysicalStorageBuffer pointer.";
            lVar21 = 0x41;
LAB_001eb03a:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar21)
            ;
            _ = (ValidationState_t *)(ulong)(uint)local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar5 = false;
          }
          else {
            if ((_Rb_tree_header *)p_Var20 != p_Var17 && (_Rb_tree_header *)p_Var27 != p_Var17) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"OpFunctionParameter ",0x14);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar24 = 
              ": can\'t specify both Aliased and Restrict for PhysicalStorageBuffer pointer.";
              lVar21 = 0x4c;
              goto LAB_001eb03a;
            }
            bVar5 = true;
          }
          local_29c = (spv_result_t)_;
          if (bVar5) {
            p_Var27 = (_Rb_tree_node_base *)((ulong)_ & 0xffffffff);
            goto LAB_001eb06f;
          }
          bVar5 = false;
        }
        else {
          if ((pIVar12->inst_).opcode == 0x20) {
            uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar12,2);
            pIVar12 = ValidationState_t::FindDef(_,uVar8);
            bVar5 = true;
            if (((pIVar12->inst_).opcode == 0x20) &&
               (SVar11 = Instruction::GetOperandAs<spv::StorageClass>(pIVar12,1),
               SVar11 == PhysicalStorageBuffer)) {
              local_208._0_4_ = (inst->inst_).result_id;
              pmVar19 = std::
                        map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                        ::operator[](&_->id_decorations_,(key_type_conflict *)&local_208);
              p_Var17 = &(pmVar19->_M_t)._M_impl.super__Rb_tree_header;
              p_Var27 = (pmVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              for (p_Var20 = p_Var27;
                  ((_Rb_tree_header *)p_Var20 != p_Var17 && (p_Var20[1]._M_color != 0x14ec));
                  p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
              }
              for (; ((_Rb_tree_header *)p_Var27 != p_Var17 && (p_Var27[1]._M_color != 0x14eb));
                  p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27)) {
              }
              if ((_Rb_tree_header *)p_Var27 == p_Var17 && (_Rb_tree_header *)p_Var20 == p_Var17) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"OpFunctionParameter ",0x14);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar24 = 
                ": expected AliasedPointer or RestrictPointer for PhysicalStorageBuffer pointer.";
                lVar21 = 0x4f;
              }
              else {
                if ((_Rb_tree_header *)p_Var20 == p_Var17 || (_Rb_tree_header *)p_Var27 == p_Var17)
                goto LAB_001eb055;
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"OpFunctionParameter ",0x14);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar24 = 
                ": can\'t specify both AliasedPointer and RestrictPointer for PhysicalStorageBuffer pointer."
                ;
                lVar21 = 0x5a;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,pcVar24,lVar21);
              p_Var27 = (_Rb_tree_node_base *)(ulong)(uint)local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar5 = false;
            }
LAB_001eb055:
            local_29c = (spv_result_t)p_Var27;
            if (!bVar5) {
              bVar5 = false;
              goto LAB_001eb078;
            }
          }
LAB_001eb06f:
          local_29c = (spv_result_t)p_Var27;
          bVar5 = true;
        }
LAB_001eb078:
        if (!bVar5) goto LAB_001eabf1;
        goto LAB_001eb080;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Too many OpFunctionParameters for ",0x22);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": expected ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," based on the function\'s type",0x1d);
      local_29c = local_208.error_;
    }
  }
LAB_001eabec:
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001eabf1:
  if (local_29c == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return local_29c;
}

Assistant:

spv_result_t FunctionPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpFunction:
      if (auto error = ValidateFunction(_, inst)) return error;
      break;
    case spv::Op::OpFunctionParameter:
      if (auto error = ValidateFunctionParameter(_, inst)) return error;
      break;
    case spv::Op::OpFunctionCall:
      if (auto error = ValidateFunctionCall(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}